

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O0

double OpenMD::dot<double>(DynamicVector<double,_std::allocator<double>_> *v1,
                          DynamicVector<double,_std::allocator<double>_> *v2)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type i;
  double tmp;
  size_type in_stack_ffffffffffffffc8;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0.0;
  local_20 = 0;
  while( true ) {
    sVar1 = DynamicVector<double,_std::allocator<double>_>::size
                      ((DynamicVector<double,_std::allocator<double>_> *)0x26d6e4);
    if (sVar1 <= local_20) break;
    pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (DynamicVector<double,_std::allocator<double>_> *)*pvVar2;
    pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_18 = (double)in_stack_ffffffffffffffd0 * *pvVar2 + local_18;
    local_20 = local_20 + 1;
  }
  return local_18;
}

Assistant:

inline Real dot(const DynamicVector<Real>& v1,
                  const DynamicVector<Real>& v2) {
    Real tmp;
    tmp = 0;
    assert(v1.size() == v2.size());
    for (typename DynamicVector<Real>::size_type i {}; i < v1.size(); i++)
      tmp += v1[i] * v2[i];

    return tmp;
  }